

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * rbuStrndup(char *zStr,int *pRc)

{
  size_t sVar1;
  void *__dest;
  char *pcVar2;
  
  if (zStr != (char *)0x0) {
    sVar1 = strlen(zStr);
    __dest = sqlite3_malloc64(sVar1 + 1);
    if (__dest != (void *)0x0) {
      pcVar2 = (char *)memcpy(__dest,zStr,sVar1 + 1);
      return pcVar2;
    }
    *pRc = 7;
  }
  return (char *)0x0;
}

Assistant:

static char *rbuStrndup(const char *zStr, int *pRc){
  char *zRet = 0;

  assert( *pRc==SQLITE_OK );
  if( zStr ){
    size_t nCopy = strlen(zStr) + 1;
    zRet = (char*)sqlite3_malloc64(nCopy);
    if( zRet ){
      memcpy(zRet, zStr, nCopy);
    }else{
      *pRc = SQLITE_NOMEM;
    }
  }

  return zRet;
}